

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  pointer *p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmLocalGenerator *pcVar2;
  cmGeneratorTarget *pcVar3;
  cmSourceFile *this_00;
  undefined8 uVar4;
  byte bVar5;
  bool bVar6;
  __type _Var7;
  int iVar8;
  TargetType TVar9;
  const_reference ppcVar10;
  char *pcVar11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *pmVar12;
  pointer ppVar13;
  const_iterator __first;
  const_iterator cVar14;
  pointer pbVar15;
  cmSystemTools *this_01;
  reference pbVar16;
  char *pcVar17;
  long lVar18;
  cmake *pcVar19;
  reference ppcVar20;
  cmMakefile *pcVar21;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *pvVar22;
  reference ppcVar23;
  reference ppcVar24;
  reference pbVar25;
  mapped_type *pmVar26;
  mapped_type *this_02;
  pointer ppVar27;
  reference ppcVar28;
  string *psVar29;
  bool local_bd5;
  allocator local_9f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  allocator local_9b1;
  string local_9b0;
  __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
  local_990;
  __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
  local_988;
  const_iterator ti_2;
  string local_978;
  CbpUnit *local_958;
  CbpUnit *unit;
  string *unitFilename;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>
  local_940;
  iterator local_938;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>
  local_930;
  const_iterator sit_1;
  _Self local_920;
  undefined1 local_918 [8];
  string hname;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8f0;
  const_iterator ext_1;
  undefined1 local_8c8 [8];
  string headerBasename;
  string *fileName_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_898;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_890;
  const_iterator sit;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *headerExts;
  CbpUnit *cbpUnit;
  string *fullPath;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_850;
  const_iterator ext;
  string *srcext;
  string lang;
  undefined1 local_818 [4];
  bool isCFile;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_7f8;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_7f0;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_7e8;
  const_iterator si;
  string local_7d8;
  string local_7b8;
  cmGeneratorTarget *local_798;
  cmGeneratorTarget *gt_1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_770;
  iterator ti_1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets_1;
  cmMakefile *makefile;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_740;
  const_iterator lg_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *srcExts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  all_files_map_t allFiles;
  undefined1 local_6d8 [8];
  string fastTarget;
  cmGeneratorTarget *gt;
  string targetName;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_688;
  iterator ti;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_660;
  const_iterator lg;
  string local_650;
  allocator local_629;
  string local_628;
  allocator local_601;
  string local_600;
  int local_5e0;
  allocator local_5d9;
  string local_5d8;
  string local_5b8;
  allocator local_591;
  string local_590;
  allocator local_569;
  string local_568;
  int local_544 [2];
  allocator local_539;
  string local_538;
  allocator local_511;
  string local_510;
  undefined1 local_4f0 [8];
  cmXMLWriter xml;
  string local_498;
  undefined1 local_478 [8];
  string makeArgs;
  string local_450;
  string local_430 [8];
  string make;
  string compiler;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e8;
  const_iterator local_3e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d0;
  const_iterator local_3c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b8;
  undefined1 local_3b0 [8];
  string fileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splitted;
  string *relative;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_340;
  const_iterator jt_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_320;
  const_iterator local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_300;
  const_iterator jt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  _Self local_2d8;
  const_iterator it;
  Tree tree;
  undefined1 local_270 [8];
  cmGeneratedFileStream fout;
  cmMakefile *mf;
  string *filename_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraCodeBlocksGenerator *this_local;
  
  ppcVar10 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0)
  ;
  fout._576_8_ = cmLocalGenerator::GetMakefile(*ppcVar10);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  cVar14._M_current = (string *)0x0;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_270,pcVar11,false,None);
  bVar5 = std::ios::operator!((ios *)(local_270 + (long)*(_func_int **)((long)local_270 + -0x18)));
  if ((bVar5 & 1) == 0) {
    Tree::Tree((Tree *)&it);
    pmVar12 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    local_2d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
         ::begin(pmVar12);
    while( true ) {
      pmVar12 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                          ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
                    ::end(pmVar12);
      bVar6 = std::operator!=(&local_2d8,
                              (_Self *)&listFiles.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar6) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&jt);
      ppVar13 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
                ::operator->(&local_2d8);
      local_300._M_current =
           (cmLocalGenerator **)
           std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                     (&ppVar13->second);
      while( true ) {
        ppVar13 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
                  ::operator->(&local_2d8);
        files = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                             (&ppVar13->second);
        bVar6 = __gnu_cxx::operator!=
                          (&local_300,
                           (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                            *)&files);
        if (!bVar6) break;
        ppcVar20 = __gnu_cxx::
                   __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                   ::operator*(&local_300);
        pcVar21 = cmLocalGenerator::GetMakefile(*ppcVar20);
        local_310 = cmMakefile::GetListFiles_abi_cxx11_(pcVar21);
        local_320._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&jt);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_318,&local_320);
        __first = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(local_310);
        cVar14 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(local_310);
        jt_1._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                       ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&jt,
                        local_318,__first._M_current,cVar14._M_current);
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&local_300);
      }
      local_348._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&jt);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_340,&local_348);
      while( true ) {
        relative = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&jt);
        bVar6 = __gnu_cxx::operator!=
                          (&local_340,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&relative);
        if (!bVar6) break;
        pbVar15 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator->(&local_340);
        psVar29 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
        lVar18 = std::__cxx11::string::find((string *)pbVar15,(ulong)psVar29);
        if (lVar18 != 0) {
          ppVar13 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
                    ::operator->(&local_2d8);
          ppcVar10 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::
                     operator[](&ppVar13->second,0);
          this_01 = (cmSystemTools *)cmLocalGenerator::GetSourceDirectory(*ppcVar10);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_340);
          pcVar11 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::RelativePath_abi_cxx11_
                    ((string *)
                     &splitted.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,this_01,pcVar11,
                     (char *)cVar14._M_current);
          p = &splitted.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&fileName.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(pvVar1);
          cmsys::SystemTools::SplitPath((string *)p,pvVar1,false);
          local_3c0._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&fileName.field_2 + 8));
          local_3b8 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator-(&local_3c0,1);
          pbVar16 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_3b8);
          std::__cxx11::string::string((string *)local_3b0,(string *)pbVar16);
          pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(&fileName.field_2._M_allocated_capacity + 1);
          local_3d8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar1);
          local_3d0 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator-(&local_3d8,1);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_3c8,&local_3d0);
          local_3e8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar1);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_3e0,&local_3e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(pvVar1,local_3c8,local_3e0);
          bVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&fileName.field_2 + 8));
          if ((!bVar6) && (lVar18 = std::__cxx11::string::find((char *)p,0xadd36f), lVar18 == -1)) {
            cVar14._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0;
            Tree::InsertPath((Tree *)&it,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&fileName.field_2 + 8),1,cVar14._M_current);
          }
          std::__cxx11::string::~string((string *)local_3b0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&fileName.field_2 + 8));
          std::__cxx11::string::~string
                    ((string *)
                     &splitted.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_340);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&jt);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
      ::operator++(&local_2d8);
    }
    GetCBCompilerId_abi_cxx11_((string *)((long)&make.field_2 + 8),this,(cmMakefile *)fout._576_8_);
    uVar4 = fout._576_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_450,"CMAKE_MAKE_PROGRAM",
               (allocator *)(makeArgs.field_2._M_local_buf + 0xf));
    pcVar11 = cmMakefile::GetRequiredDefinition((cmMakefile *)uVar4,&local_450);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_430,pcVar11,(allocator *)(makeArgs.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(makeArgs.field_2._M_local_buf + 0xe));
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator((allocator<char> *)(makeArgs.field_2._M_local_buf + 0xf));
    uVar4 = fout._576_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_498,"CMAKE_CODEBLOCKS_MAKE_ARGUMENTS",(allocator *)&xml.field_0x4f);
    pcVar11 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar4,&local_498);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_478,pcVar11,(allocator *)&xml.field_0x4e);
    std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x4e);
    std::__cxx11::string::~string((string *)&local_498);
    std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x4f);
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_4f0,(ostream *)local_270,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_4f0,"UTF-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_510,"CodeBlocks_project_file",&local_511);
    cmXMLWriter::StartElement((cmXMLWriter *)local_4f0,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_538,"FileVersion",&local_539);
    cmXMLWriter::StartElement((cmXMLWriter *)local_4f0,&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator((allocator<char> *)&local_539);
    local_544[1] = 1;
    cmXMLWriter::Attribute<int>((cmXMLWriter *)local_4f0,"major",local_544 + 1);
    local_544[0] = 6;
    cmXMLWriter::Attribute<int>((cmXMLWriter *)local_4f0,"minor",local_544);
    cmXMLWriter::EndElement((cmXMLWriter *)local_4f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_568,"Project",&local_569);
    cmXMLWriter::StartElement((cmXMLWriter *)local_4f0,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_590,"Option",&local_591);
    cmXMLWriter::StartElement((cmXMLWriter *)local_4f0,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator((allocator<char> *)&local_591);
    ppcVar10 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                         (lgs,0);
    cmLocalGenerator::GetProjectName_abi_cxx11_(&local_5b8,*ppcVar10);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_4f0,"title",&local_5b8);
    std::__cxx11::string::~string((string *)&local_5b8);
    cmXMLWriter::EndElement((cmXMLWriter *)local_4f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5d8,"Option",&local_5d9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_4f0,&local_5d8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
    local_5e0 = 1;
    cmXMLWriter::Attribute<int>((cmXMLWriter *)local_4f0,"makefile_is_custom",&local_5e0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_4f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_600,"Option",&local_601);
    cmXMLWriter::StartElement((cmXMLWriter *)local_4f0,&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator((allocator<char> *)&local_601);
    cmXMLWriter::Attribute<std::__cxx11::string>
              ((cmXMLWriter *)local_4f0,"compiler",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&make.field_2 + 8));
    cmXMLWriter::EndElement((cmXMLWriter *)local_4f0);
    Tree::BuildVirtualFolder((Tree *)&it,(cmXMLWriter *)local_4f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_628,"Build",&local_629);
    cmXMLWriter::StartElement((cmXMLWriter *)local_4f0,&local_628);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator((allocator<char> *)&local_629);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_650,"all",(allocator *)((long)&lg._M_current + 7))
    ;
    pcVar11 = (char *)std::__cxx11::string::c_str();
    ppcVar10 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                         (lgs,0);
    pcVar2 = *ppcVar10;
    pcVar17 = (char *)std::__cxx11::string::c_str();
    AppendTarget(this,(cmXMLWriter *)local_4f0,&local_650,(cmGeneratorTarget *)0x0,pcVar11,pcVar2,
                 pcVar17,(string *)local_478);
    std::__cxx11::string::~string((string *)&local_650);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lg._M_current + 7));
    local_660._M_current =
         (cmLocalGenerator **)
         std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs);
    while( true ) {
      targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs);
      bVar6 = __gnu_cxx::operator!=
                        (&local_660,
                         (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                          *)&targets.
                             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar6) break;
      ppcVar20 = __gnu_cxx::
                 __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                 ::operator*(&local_660);
      pvVar22 = cmLocalGenerator::GetGeneratorTargets(*ppcVar20);
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti,pvVar22);
      local_688._M_current =
           (cmGeneratorTarget **)
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
      while( true ) {
        targetName.field_2._8_8_ =
             std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                       ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
        bVar6 = __gnu_cxx::operator!=
                          (&local_688,
                           (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                            *)((long)&targetName.field_2 + 8));
        if (!bVar6) break;
        ppcVar23 = __gnu_cxx::
                   __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                   ::operator*(&local_688);
        psVar29 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar23);
        std::__cxx11::string::string((string *)&gt,(string *)psVar29);
        ppcVar23 = __gnu_cxx::
                   __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                   ::operator*(&local_688);
        TVar9 = cmGeneratorTarget::GetType(*ppcVar23);
        if (TVar9 < UTILITY) {
          ppcVar23 = __gnu_cxx::
                     __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                     ::operator*(&local_688);
          pcVar3 = *ppcVar23;
          fastTarget.field_2._8_8_ = pcVar3;
          pcVar11 = (char *)std::__cxx11::string::c_str();
          ppcVar20 = __gnu_cxx::
                     __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                     ::operator*(&local_660);
          pcVar2 = *ppcVar20;
          pcVar17 = (char *)std::__cxx11::string::c_str();
          AppendTarget(this,(cmXMLWriter *)local_4f0,(string *)&gt,pcVar3,pcVar11,pcVar2,pcVar17,
                       (string *)local_478);
          std::__cxx11::string::string((string *)local_6d8,(string *)&gt);
          std::__cxx11::string::operator+=((string *)local_6d8,"/fast");
          uVar4 = fastTarget.field_2._8_8_;
          pcVar11 = (char *)std::__cxx11::string::c_str();
          ppcVar20 = __gnu_cxx::
                     __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                     ::operator*(&local_660);
          pcVar2 = *ppcVar20;
          pcVar17 = (char *)std::__cxx11::string::c_str();
          AppendTarget(this,(cmXMLWriter *)local_4f0,(string *)local_6d8,(cmGeneratorTarget *)uVar4,
                       pcVar11,pcVar2,pcVar17,(string *)local_478);
          std::__cxx11::string::~string((string *)local_6d8);
        }
        else if (TVar9 == UTILITY) {
          lVar18 = std::__cxx11::string::find((char *)&gt,0xafd1c3);
          if ((((lVar18 != 0) ||
               (bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&gt,"Nightly"), !bVar6)) &&
              ((lVar18 = std::__cxx11::string::find((char *)&gt,0xafd1cb), lVar18 != 0 ||
               (bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&gt,"Continuous"), !bVar6)))) &&
             ((lVar18 = std::__cxx11::string::find((char *)&gt,0xb0b3c5), lVar18 != 0 ||
              (bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&gt,"Experimental"), !bVar6)))) {
            pcVar11 = (char *)std::__cxx11::string::c_str();
            ppcVar20 = __gnu_cxx::
                       __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                       ::operator*(&local_660);
            pcVar2 = *ppcVar20;
            pcVar17 = (char *)std::__cxx11::string::c_str();
            AppendTarget(this,(cmXMLWriter *)local_4f0,(string *)&gt,(cmGeneratorTarget *)0x0,
                         pcVar11,pcVar2,pcVar17,(string *)local_478);
          }
        }
        else if (TVar9 == GLOBAL_TARGET) {
          ppcVar20 = __gnu_cxx::
                     __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                     ::operator*(&local_660);
          pcVar11 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar20);
          ppcVar20 = __gnu_cxx::
                     __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                     ::operator*(&local_660);
          pcVar17 = cmLocalGenerator::GetBinaryDirectory(*ppcVar20);
          iVar8 = strcmp(pcVar11,pcVar17);
          if (iVar8 == 0) {
            pcVar11 = (char *)std::__cxx11::string::c_str();
            ppcVar20 = __gnu_cxx::
                       __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                       ::operator*(&local_660);
            pcVar2 = *ppcVar20;
            pcVar17 = (char *)std::__cxx11::string::c_str();
            AppendTarget(this,(cmXMLWriter *)local_4f0,(string *)&gt,(cmGeneratorTarget *)0x0,
                         pcVar11,pcVar2,pcVar17,(string *)local_478);
          }
        }
        std::__cxx11::string::~string((string *)&gt);
        __gnu_cxx::
        __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
        ::operator++(&local_688,0);
      }
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
      __gnu_cxx::
      __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
      ::operator++(&local_660,0);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_4f0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
           *)&cFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&srcExts);
    pcVar19 = cmGlobalGenerator::GetCMakeInstance
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    lg_1._M_current = (cmLocalGenerator **)cmake::GetSourceExtensions_abi_cxx11_(pcVar19);
    local_740._M_current =
         (cmLocalGenerator **)
         std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs);
    while( true ) {
      makefile = (cmMakefile *)
                 std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs);
      bVar6 = __gnu_cxx::operator!=
                        (&local_740,
                         (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                          *)&makefile);
      if (!bVar6) break;
      ppcVar20 = __gnu_cxx::
                 __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                 ::operator*(&local_740);
      pcVar21 = cmLocalGenerator::GetMakefile(*ppcVar20);
      ppcVar20 = __gnu_cxx::
                 __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                 ::operator*(&local_740);
      pvVar22 = cmLocalGenerator::GetGeneratorTargets(*ppcVar20);
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti_1,pvVar22)
      ;
      local_770._M_current =
           (cmGeneratorTarget **)
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti_1);
      while( true ) {
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                  *)&ti_1);
        bVar6 = __gnu_cxx::operator!=
                          (&local_770,
                           (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                            *)&sources.
                               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar6) break;
        ppcVar23 = __gnu_cxx::
                   __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                   ::operator*(&local_770);
        TVar9 = cmGeneratorTarget::GetType(*ppcVar23);
        if (TVar9 < GLOBAL_TARGET) {
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt_1);
          ppcVar23 = __gnu_cxx::
                     __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                     ::operator*(&local_770);
          pcVar3 = *ppcVar23;
          local_798 = pcVar3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_7d8,"CMAKE_BUILD_TYPE",(allocator *)((long)&si._M_current + 7)
                    );
          pcVar11 = cmMakefile::GetSafeDefinition(pcVar21,&local_7d8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_7b8,pcVar11,(allocator *)((long)&si._M_current + 6));
          cmGeneratorTarget::GetSourceFiles
                    (pcVar3,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt_1,
                     &local_7b8);
          std::__cxx11::string::~string((string *)&local_7b8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&si._M_current + 6));
          std::__cxx11::string::~string((string *)&local_7d8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&si._M_current + 7));
          local_7f0._M_current =
               (cmSourceFile **)
               std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                         ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt_1);
          __gnu_cxx::
          __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
          ::__normal_iterator<cmSourceFile**>
                    ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                      *)&local_7e8,&local_7f0);
          while( true ) {
            local_7f8._M_current =
                 (cmSourceFile **)
                 std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                           ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt_1);
            bVar6 = __gnu_cxx::operator!=(&local_7e8,&local_7f8);
            if (!bVar6) break;
            lang.field_2._M_local_buf[0xe] = '\0';
            lang.field_2._M_local_buf[0xd] = '\0';
            TVar9 = cmGeneratorTarget::GetType(local_798);
            local_bd5 = false;
            if (TVar9 == UTILITY) {
              ppcVar24 = __gnu_cxx::
                         __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                         ::operator*(&local_7e8);
              this_00 = *ppcVar24;
              std::allocator<char>::allocator();
              lang.field_2._M_local_buf[0xe] = '\x01';
              std::__cxx11::string::string
                        ((string *)local_818,"GENERATED",
                         (allocator *)(lang.field_2._M_local_buf + 0xf));
              lang.field_2._M_local_buf[0xd] = '\x01';
              local_bd5 = cmSourceFile::GetPropertyAsBool(this_00,(string *)local_818);
            }
            if ((lang.field_2._M_local_buf[0xd] & 1U) != 0) {
              std::__cxx11::string::~string((string *)local_818);
            }
            if ((lang.field_2._M_local_buf[0xe] & 1U) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)(lang.field_2._M_local_buf + 0xf))
              ;
            }
            if (local_bd5 == false) {
              lang.field_2._M_local_buf[0xc] = '\0';
              ppcVar24 = __gnu_cxx::
                         __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                         ::operator*(&local_7e8);
              cmSourceFile::GetLanguage_abi_cxx11_((string *)&srcext,*ppcVar24);
              bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&srcext,"C");
              if ((bVar6) ||
                 (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&srcext,"CXX"), bVar6)) {
                ppcVar24 = __gnu_cxx::
                           __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                           ::operator*(&local_7e8);
                ext._M_current = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar24);
                local_850._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)lg_1._M_current);
                while( true ) {
                  fullPath = (string *)
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)lg_1._M_current);
                  bVar6 = __gnu_cxx::operator!=
                                    (&local_850,
                                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&fullPath);
                  cVar14 = ext;
                  if (!bVar6) break;
                  pbVar25 = __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&local_850);
                  _Var7 = std::operator==(cVar14._M_current,pbVar25);
                  if (_Var7) {
                    lang.field_2._M_local_buf[0xc] = '\x01';
                    break;
                  }
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_850);
                }
              }
              ppcVar24 = __gnu_cxx::
                         __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                         ::operator*(&local_7e8);
              psVar29 = cmSourceFile::GetFullPath(*ppcVar24,(string *)0x0);
              if ((lang.field_2._M_local_buf[0xc] & 1U) != 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&srcExts,psVar29);
              }
              pmVar26 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                      *)&cFiles.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar29)
              ;
              ppcVar23 = __gnu_cxx::
                         __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                         ::operator*(&local_770);
              std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              push_back(&pmVar26->Targets,ppcVar23);
              std::__cxx11::string::~string((string *)&srcext);
            }
            __gnu_cxx::
            __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
            ::operator++(&local_7e8,0);
          }
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt_1);
        }
        __gnu_cxx::
        __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
        ::operator++(&local_770,0);
      }
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti_1);
      __gnu_cxx::
      __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
      ::operator++(&local_740,0);
    }
    pcVar19 = cmGlobalGenerator::GetCMakeInstance
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    sit._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         cmake::GetHeaderExtensions_abi_cxx11_(pcVar19);
    local_898._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&srcExts);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_890,&local_898);
    while( true ) {
      fileName_1 = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&srcExts);
      bVar6 = __gnu_cxx::operator!=
                        (&local_890,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&fileName_1);
      if (!bVar6) break;
      headerBasename.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_890);
      cmsys::SystemTools::GetFilenamePath
                ((string *)local_8c8,(string *)headerBasename.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_8c8,"/");
      cmsys::SystemTools::GetFilenameWithoutExtension
                ((string *)&ext_1,(string *)headerBasename.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_8c8,(string *)&ext_1);
      std::__cxx11::string::~string((string *)&ext_1);
      local_8f0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(sit._M_current);
      while( true ) {
        hname.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)sit._M_current);
        bVar6 = __gnu_cxx::operator!=
                          (&local_8f0,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&hname.field_2 + 8));
        if (!bVar6) break;
        std::__cxx11::string::string((string *)local_918,(string *)local_8c8);
        std::__cxx11::string::operator+=((string *)local_918,".");
        pbVar25 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_8f0);
        std::__cxx11::string::operator+=((string *)local_918,(string *)pbVar25);
        local_920._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                     *)&cFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)local_918);
        sit_1._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    *)&cFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar6 = std::operator!=(&local_920,(_Self *)&sit_1);
        if (bVar6) {
          tree.files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x22;
        }
        else {
          pcVar11 = (char *)std::__cxx11::string::c_str();
          bVar6 = cmsys::SystemTools::FileExists(pcVar11);
          if (bVar6) {
            pmVar26 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                    *)&cFiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (key_type *)headerBasename.field_2._8_8_);
            this_02 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                    *)&cFiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (key_type *)local_918);
            std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator=(&this_02->Targets,&pmVar26->Targets);
            tree.files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x22;
          }
          else {
            tree.files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          }
        }
        std::__cxx11::string::~string((string *)local_918);
        if ((int)tree.files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) break;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_8f0);
      }
      std::__cxx11::string::~string((string *)local_8c8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_890);
    }
    local_938._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                  *)&cFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>
    ::_Rb_tree_const_iterator(&local_930,&local_938);
    while( true ) {
      unitFilename = (string *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                            *)&cFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>
      ::_Rb_tree_const_iterator(&local_940,(iterator *)&unitFilename);
      bVar6 = std::operator!=(&local_930,&local_940);
      if (!bVar6) break;
      unit = (CbpUnit *)
             std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>
             ::operator->(&local_930);
      ppVar27 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>
                ::operator->(&local_930);
      local_958 = &ppVar27->second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_978,"Unit",(allocator *)((long)&ti_2._M_current + 7));
      cmXMLWriter::StartElement((cmXMLWriter *)local_4f0,&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ti_2._M_current + 7));
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_4f0,"filename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit);
      local_988._M_current =
           (cmGeneratorTarget **)
           std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::begin
                     (&local_958->Targets);
      while( true ) {
        local_990._M_current =
             (cmGeneratorTarget **)
             std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::end
                       (&local_958->Targets);
        bVar6 = __gnu_cxx::operator!=(&local_988,&local_990);
        if (!bVar6) break;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_9b0,"Option",&local_9b1);
        cmXMLWriter::StartElement((cmXMLWriter *)local_4f0,&local_9b0);
        std::__cxx11::string::~string((string *)&local_9b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
        ppcVar28 = __gnu_cxx::
                   __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                   ::operator*(&local_988);
        psVar29 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar28);
        cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_4f0,"target",psVar29);
        cmXMLWriter::EndElement((cmXMLWriter *)local_4f0);
        __gnu_cxx::
        __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
        ::operator++(&local_988);
      }
      cmXMLWriter::EndElement((cmXMLWriter *)local_4f0);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>
      ::operator++(&local_930);
    }
    pcVar11 = cmMakefile::GetHomeDirectory((cmMakefile *)fout._576_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9f8,pcVar11,&local_9f9);
    std::operator+(&local_9d8,&local_9f8,"/");
    Tree::BuildUnit((Tree *)&it,(cmXMLWriter *)local_4f0,&local_9d8);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::__cxx11::string::~string((string *)&local_9f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
    cmXMLWriter::EndElement((cmXMLWriter *)local_4f0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_4f0);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_4f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&srcExts);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
            *)&cFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_4f0);
    std::__cxx11::string::~string((string *)local_478);
    std::__cxx11::string::~string(local_430);
    std::__cxx11::string::~string((string *)(make.field_2._M_local_buf + 8));
    Tree::~Tree((Tree *)&it);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_270);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  Tree tree;

  // build tree of virtual folders
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
         it = this->GlobalGenerator->GetProjectMap().begin();
       it != this->GlobalGenerator->GetProjectMap().end(); ++it) {
    // Collect all files
    std::vector<std::string> listFiles;
    for (std::vector<cmLocalGenerator*>::const_iterator jt =
           it->second.begin();
         jt != it->second.end(); ++jt) {
      const std::vector<std::string>& files =
        (*jt)->GetMakefile()->GetListFiles();
      listFiles.insert(listFiles.end(), files.begin(), files.end());
    }

    // Convert
    for (std::vector<std::string>::const_iterator jt = listFiles.begin();
         jt != listFiles.end(); ++jt) {
      // don't put cmake's own files into the project (#12110):
      if (jt->find(cmSystemTools::GetCMakeRoot()) == 0) {
        continue;
      }

      const std::string& relative = cmSystemTools::RelativePath(
        it->second[0]->GetSourceDirectory(), jt->c_str());
      std::vector<std::string> splitted;
      cmSystemTools::SplitPath(relative, splitted, false);
      // Split filename from path
      std::string fileName = *(splitted.end() - 1);
      splitted.erase(splitted.end() - 1, splitted.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      if (!splitted.empty() &&
          relative.find("CMakeFiles") == std::string::npos) {
        tree.InsertPath(splitted, 1, fileName);
      }
    }
  }

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs =
    mf->GetSafeDefinition("CMAKE_CODEBLOCKS_MAKE_ARGUMENTS");

  cmXMLWriter xml(fout);
  xml.StartDocument();
  xml.StartElement("CodeBlocks_project_file");

  xml.StartElement("FileVersion");
  xml.Attribute("major", 1);
  xml.Attribute("minor", 6);
  xml.EndElement();

  xml.StartElement("Project");

  xml.StartElement("Option");
  xml.Attribute("title", lgs[0]->GetProjectName());
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("makefile_is_custom", 1);
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("compiler", compiler);
  xml.EndElement();

  // Now build a virtual tree
  tree.BuildVirtualFolder(xml);

  xml.StartElement("Build");

  this->AppendTarget(xml, "all", CM_NULLPTR, make.c_str(), lgs[0],
                     compiler.c_str(), makeArgs);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg = lgs.begin();
       lg != lgs.end(); lg++) {
    std::vector<cmGeneratorTarget*> targets = (*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++) {
      std::string targetName = (*ti)->GetName();
      switch ((*ti)->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp((*lg)->GetCurrentBinaryDirectory(),
                     (*lg)->GetBinaryDirectory()) == 0) {
            this->AppendTarget(xml, targetName, CM_NULLPTR, make.c_str(), *lg,
                               compiler.c_str(), makeArgs);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(xml, targetName, CM_NULLPTR, make.c_str(), *lg,
                             compiler.c_str(), makeArgs);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          cmGeneratorTarget* gt = *ti;
          this->AppendTarget(xml, targetName, gt, make.c_str(), *lg,
                             compiler.c_str(), makeArgs);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(xml, fastTarget, gt, make.c_str(), *lg,
                             compiler.c_str(), makeArgs);
        } break;
        default:
          break;
      }
    }
  }

  xml.EndElement(); // Build

  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an acompanying header
  // that should be looked for.
  typedef std::map<std::string, CbpUnit> all_files_map_t;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  std::vector<std::string> const& srcExts =
    this->GlobalGenerator->GetCMakeInstance()->GetSourceExtensions();

  for (std::vector<cmLocalGenerator*>::const_iterator lg = lgs.begin();
       lg != lgs.end(); lg++) {
    cmMakefile* makefile = (*lg)->GetMakefile();
    std::vector<cmGeneratorTarget*> targets = (*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++) {
      switch ((*ti)->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
        case cmStateEnums::UTILITY: // can have sources since 2.6.3
        {
          std::vector<cmSourceFile*> sources;
          cmGeneratorTarget* gt = *ti;
          gt->GetSourceFiles(sources,
                             makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si = sources.begin();
               si != sources.end(); si++) {
            // don't add source files from UTILITY target which have the
            // GENERATED property set:
            if (gt->GetType() == cmStateEnums::UTILITY &&
                (*si)->GetPropertyAsBool("GENERATED")) {
              continue;
            }

            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX") {
              std::string const& srcext = (*si)->GetExtension();
              for (std::vector<std::string>::const_iterator ext =
                     srcExts.begin();
                   ext != srcExts.end(); ++ext) {
                if (srcext == *ext) {
                  isCFile = true;
                  break;
                }
              }
            }

            std::string const& fullPath = (*si)->GetFullPath();

            if (isCFile) {
              cFiles.push_back(fullPath);
            }

            CbpUnit& cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(*ti);
          }
        }
        default: // intended fallthrough
          break;
      }
    }
  }

  std::vector<std::string> const& headerExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::vector<std::string>::const_iterator sit = cFiles.begin();
       sit != cFiles.end(); ++sit) {
    std::string const& fileName = *sit;
    std::string headerBasename = cmSystemTools::GetFilenamePath(fileName);
    headerBasename += "/";
    headerBasename += cmSystemTools::GetFilenameWithoutExtension(fileName);

    // check if there's a matching header around
    for (std::vector<std::string>::const_iterator ext = headerExts.begin();
         ext != headerExts.end(); ++ext) {
      std::string hname = headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end()) {
        break;
      }

      if (cmSystemTools::FileExists(hname.c_str())) {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
      }
    }
  }

  // insert all source files in the CodeBlocks project
  for (all_files_map_t::const_iterator sit = allFiles.begin();
       sit != allFiles.end(); ++sit) {
    std::string const& unitFilename = sit->first;
    CbpUnit const& unit = sit->second;

    xml.StartElement("Unit");
    xml.Attribute("filename", unitFilename);

    for (std::vector<const cmGeneratorTarget*>::const_iterator ti =
           unit.Targets.begin();
         ti != unit.Targets.end(); ++ti) {
      xml.StartElement("Option");
      xml.Attribute("target", (*ti)->GetName());
      xml.EndElement();
    }

    xml.EndElement();
  }

  // Add CMakeLists.txt
  tree.BuildUnit(xml, std::string(mf->GetHomeDirectory()) + "/");

  xml.EndElement(); // Project
  xml.EndElement(); // CodeBlocks_project_file
  xml.EndDocument();
}